

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O3

void __thiscall
QArrayDataPointer<unsigned_long_long>::relocate
          (QArrayDataPointer<unsigned_long_long> *this,qsizetype offset,unsigned_long_long **data)

{
  unsigned_long_long *d_first;
  unsigned_long_long *puVar1;
  
  d_first = this->ptr + offset;
  QtPrivate::q_relocate_overlap_n<unsigned_long_long,long_long>(this->ptr,this->size,d_first);
  if (data != (unsigned_long_long **)0x0) {
    puVar1 = *data;
    if ((this->ptr <= puVar1) && (puVar1 < this->ptr + this->size)) {
      *data = puVar1 + offset;
    }
  }
  this->ptr = d_first;
  return;
}

Assistant:

void relocate(qsizetype offset, const T **data = nullptr)
    {
        T *res = this->ptr + offset;
        QtPrivate::q_relocate_overlap_n(this->ptr, this->size, res);
        // first update data pointer, then this->ptr
        if (data && QtPrivate::q_points_into_range(*data, *this))
            *data += offset;
        this->ptr = res;
    }